

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_comp.cpp
# Opt level: O0

error_code __thiscall basisu::basis_compressor::encode_slices_to_uastc(basis_compressor *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  gpu_image *pgVar4;
  image *piVar5;
  size_t sVar6;
  uint64_t *r;
  unsigned_short *puVar7;
  long in_RDI;
  bool status;
  uastc_rdo_params rdo_params;
  uint32_t last_index;
  uint32_t first_index;
  uint32_t block_index_iter;
  uint32_t N;
  atomic<unsigned_int> total_blocks_processed;
  image *source_image;
  uint32_t total_blocks;
  uint32_t num_blocks_y;
  uint32_t num_blocks_x;
  basisu_backend_slice_desc *slice_desc;
  gpu_image *tex;
  uint32_t slice_index_1;
  uint32_t slice_index;
  uint in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  gpu_image *in_stack_fffffffffffffe80;
  anon_class_56_9_56d66aa5 *in_stack_fffffffffffffe88;
  function<void_()> *in_stack_fffffffffffffe90;
  uint local_15c;
  job_pool *in_stack_fffffffffffffea8;
  job_pool *in_stack_fffffffffffffeb0;
  job_pool *in_stack_fffffffffffffec0;
  job_pool *in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff8c;
  uastc_rdo_params *in_stack_ffffffffffffff90;
  color_rgba *in_stack_ffffffffffffff98;
  uastc_block *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffac;
  uint local_4c;
  uint32_t total_jobs;
  uint local_18;
  undefined4 local_14;
  
  debug_printf("basis_compressor::encode_slices_to_uastc\n");
  vector<basisu::basisu_backend_slice_desc>::size
            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
  vector<basisu::gpu_image>::resize
            ((vector<basisu::gpu_image> *)in_stack_fffffffffffffe90,
             (size_t)in_stack_fffffffffffffe88,SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
  local_15c = in_stack_fffffffffffffe78;
  for (local_14 = 0;
      uVar3 = vector<basisu::basisu_backend_slice_desc>::size
                        ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280)),
      (uint)local_14 < uVar3; local_14 = local_14 + 1) {
    pgVar4 = vector<basisu::gpu_image>::operator[]
                       ((vector<basisu::gpu_image> *)in_stack_fffffffffffffe80,
                        CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    vector<basisu::basisu_backend_slice_desc>::operator[]
              ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    vector<basisu::basisu_backend_slice_desc>::operator[]
              ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    gpu_image::init(pgVar4,(EVP_PKEY_CTX *)0x13);
  }
  *(undefined4 *)(in_RDI + 0x6d8) = 1;
  *(undefined1 *)(in_RDI + 0x6dc) = 0;
  vector<basisu::basisu_backend_slice_desc>::operator=
            ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffe88,
             (vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffe80);
  vector<basisu::basisu_backend_slice_desc>::size
            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
  vector<basisu::vector<unsigned_char>_>::resize
            ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffe90,
             (size_t)in_stack_fffffffffffffe88,SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
  vector<basisu::basisu_backend_slice_desc>::size
            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
  vector<unsigned_short>::resize
            ((vector<unsigned_short> *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
             SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
  local_18 = 0;
  do {
    uVar3 = vector<basisu::basisu_backend_slice_desc>::size
                      ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 0x280));
    if (uVar3 <= local_18) {
      return cECSuccess;
    }
    pgVar4 = vector<basisu::gpu_image>::operator[]
                       ((vector<basisu::gpu_image> *)in_stack_fffffffffffffe80,
                        CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    vector<basisu::basisu_backend_slice_desc>::operator[]
              ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    gpu_image::get_blocks_x(pgVar4);
    gpu_image::get_blocks_y(pgVar4);
    uVar3 = gpu_image::get_total_blocks(pgVar4);
    piVar5 = vector<basisu::image>::operator[]
                       ((vector<basisu::image> *)in_stack_fffffffffffffe80,
                        CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    std::__atomic_base<unsigned_int>::operator=
              ((__atomic_base<unsigned_int> *)in_stack_fffffffffffffe88,
               (__int_type_conflict)((ulong)in_stack_fffffffffffffe80 >> 0x20));
    for (local_4c = 0; total_jobs = (uint32_t)piVar5, local_4c < uVar3; local_4c = local_4c + 0x100)
    {
      in_stack_ffffffffffffffac = minimum<unsigned_int>(uVar3,local_4c + 0x100);
      in_stack_ffffffffffffff80 = (job_pool *)&stack0xffffffffffffffbc;
      std::function<void()>::function<basisu::basis_compressor::encode_slices_to_uastc()::__0,void>
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      job_pool::add_job(in_stack_fffffffffffffeb0,(function<void_()> *)in_stack_fffffffffffffea8);
      std::function<void_()>::~function((function<void_()> *)0x4bb749);
    }
    job_pool::wait_for_all(in_stack_fffffffffffffec0);
    bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x148));
    if (bVar1) {
      uastc_rdo_params::uastc_rdo_params((uastc_rdo_params *)0x4bb7c5);
      param::operator_cast_to_float((param *)(in_RDI + 0x14c));
      param::operator_cast_to_float((param *)(in_RDI + 0x19c));
      param::operator_cast_to_float((param *)(in_RDI + 0x1b0));
      param::operator_cast_to_int((param *)(in_RDI + 0x160));
      param::operator_cast_to_float((param *)(in_RDI + 0x174));
      param::operator_cast_to_float((param *)(in_RDI + 0x188));
      gpu_image::get_total_blocks(pgVar4);
      in_stack_fffffffffffffec0 = (job_pool *)gpu_image::get_ptr((gpu_image *)0x4bb88f);
      vector<basisu::pixel_block>::operator[]
                ((vector<basisu::pixel_block> *)in_stack_fffffffffffffe80,
                 CONCAT44(in_stack_fffffffffffffe7c,local_15c));
      bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x1c6));
      if (bVar1) {
        in_stack_fffffffffffffea8 = *(job_pool **)(in_RDI + 0x240);
      }
      else {
        in_stack_fffffffffffffea8 = (job_pool *)0x0;
      }
      in_stack_fffffffffffffeb0 = in_stack_fffffffffffffea8;
      bVar1 = bool_param::operator_cast_to_bool((bool_param *)(in_RDI + 0x1c6));
      if ((bVar1) && (*(long *)(in_RDI + 0x240) != 0)) {
        sVar6 = job_pool::get_total_threads((job_pool *)0x4bb946);
        local_15c = minimum<unsigned_int>(4,(uint)sVar6);
      }
      else {
        local_15c = 0;
      }
      bVar1 = uastc_rdo(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                        in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,total_jobs);
      if (!bVar1) {
        return cECFailedUASTCRDOPostProcess;
      }
    }
    in_stack_fffffffffffffe80 =
         (gpu_image *)
         vector<basisu::vector<unsigned_char>_>::operator[]
                   ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffe80,
                    CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    gpu_image::get_size_in_bytes(in_stack_fffffffffffffe80);
    vector<unsigned_char>::resize
              ((vector<unsigned_char> *)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
               SUB81((ulong)in_stack_fffffffffffffe80 >> 0x38,0));
    vector<basisu::vector<unsigned_char>_>::operator[]
              ((vector<basisu::vector<unsigned_char>_> *)in_stack_fffffffffffffe80,
               CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    in_stack_fffffffffffffe88 =
         (anon_class_56_9_56d66aa5 *)
         vector<unsigned_char>::operator[]
                   ((vector<unsigned_char> *)in_stack_fffffffffffffe80,
                    CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    in_stack_fffffffffffffe90 = (function<void_()> *)gpu_image::get_ptr((gpu_image *)0x4bba33);
    uVar3 = gpu_image::get_size_in_bytes(in_stack_fffffffffffffe80);
    memcpy(in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,(ulong)uVar3);
    r = gpu_image::get_ptr((gpu_image *)0x4bba65);
    uVar3 = gpu_image::get_size_in_bytes(in_stack_fffffffffffffe80);
    uVar2 = basist::crc16(r,(ulong)uVar3,0);
    puVar7 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)in_stack_fffffffffffffe80,
                        CONCAT44(in_stack_fffffffffffffe7c,local_15c));
    *puVar7 = uVar2;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

basis_compressor::error_code basis_compressor::encode_slices_to_uastc()
	{
		debug_printf("basis_compressor::encode_slices_to_uastc\n");

		m_uastc_slice_textures.resize(m_slice_descs.size());
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
			m_uastc_slice_textures[slice_index].init(texture_format::cUASTC4x4, m_slice_descs[slice_index].m_orig_width, m_slice_descs[slice_index].m_orig_height);

		m_uastc_backend_output.m_tex_format = basist::basis_tex_format::cUASTC4x4;
		m_uastc_backend_output.m_etc1s = false;
		m_uastc_backend_output.m_slice_desc = m_slice_descs;
		m_uastc_backend_output.m_slice_image_data.resize(m_slice_descs.size());
		m_uastc_backend_output.m_slice_image_crcs.resize(m_slice_descs.size());
				
		for (uint32_t slice_index = 0; slice_index < m_slice_descs.size(); slice_index++)
		{
			gpu_image& tex = m_uastc_slice_textures[slice_index];
			basisu_backend_slice_desc& slice_desc = m_slice_descs[slice_index];
			(void)slice_desc;

			const uint32_t num_blocks_x = tex.get_blocks_x();
			const uint32_t num_blocks_y = tex.get_blocks_y();
			const uint32_t total_blocks = tex.get_total_blocks();
			const image& source_image = m_slice_images[slice_index];
			
			std::atomic<uint32_t> total_blocks_processed;
			total_blocks_processed = 0;

			const uint32_t N = 256;
			for (uint32_t block_index_iter = 0; block_index_iter < total_blocks; block_index_iter += N)
			{
				const uint32_t first_index = block_index_iter;
				const uint32_t last_index = minimum<uint32_t>(total_blocks, block_index_iter + N);

				// FIXME: This sucks, but we're having a stack size related problem with std::function with emscripten.
#ifndef __EMSCRIPTEN__
				m_params.m_pJob_pool->add_job([this, first_index, last_index, num_blocks_x, num_blocks_y, total_blocks, &source_image, &tex, &total_blocks_processed]
					{
#endif
						BASISU_NOTE_UNUSED(num_blocks_y);
						
						uint32_t uastc_flags = m_params.m_pack_uastc_flags;
						if ((m_params.m_rdo_uastc) && (m_params.m_rdo_uastc_favor_simpler_modes_in_rdo_mode))
							uastc_flags |= cPackUASTCFavorSimplerModes;

						for (uint32_t block_index = first_index; block_index < last_index; block_index++)
						{
							const uint32_t block_x = block_index % num_blocks_x;
							const uint32_t block_y = block_index / num_blocks_x;

							color_rgba block_pixels[4][4];

							source_image.extract_block_clamped((color_rgba*)block_pixels, block_x * 4, block_y * 4, 4, 4);

							basist::uastc_block& dest_block = *(basist::uastc_block*)tex.get_block_ptr(block_x, block_y);

							encode_uastc(&block_pixels[0][0].r, dest_block, uastc_flags);

							total_blocks_processed++;
							
							uint32_t val = total_blocks_processed;
							if ((val & 16383) == 16383)
							{
								debug_printf("basis_compressor::encode_slices_to_uastc: %3.1f%% done\n", static_cast<float>(val) * 100.0f / total_blocks);
							}

						}

#ifndef __EMSCRIPTEN__
					});
#endif

			} // block_index_iter

#ifndef __EMSCRIPTEN__
			m_params.m_pJob_pool->wait_for_all();
#endif

			if (m_params.m_rdo_uastc)
			{
				uastc_rdo_params rdo_params;
				rdo_params.m_lambda = m_params.m_rdo_uastc_quality_scalar;
				rdo_params.m_max_allowed_rms_increase_ratio = m_params.m_rdo_uastc_max_allowed_rms_increase_ratio;
				rdo_params.m_skip_block_rms_thresh = m_params.m_rdo_uastc_skip_block_rms_thresh;
				rdo_params.m_lz_dict_size = m_params.m_rdo_uastc_dict_size;
				rdo_params.m_smooth_block_max_error_scale = m_params.m_rdo_uastc_max_smooth_block_error_scale;
				rdo_params.m_max_smooth_block_std_dev = m_params.m_rdo_uastc_smooth_block_max_std_dev;
								
				bool status = uastc_rdo(tex.get_total_blocks(), (basist::uastc_block*)tex.get_ptr(),
					(const color_rgba *)m_source_blocks[slice_desc.m_first_block_index].m_pixels, rdo_params, m_params.m_pack_uastc_flags, m_params.m_rdo_uastc_multithreading ? m_params.m_pJob_pool : nullptr,
					(m_params.m_rdo_uastc_multithreading && m_params.m_pJob_pool) ? basisu::minimum<uint32_t>(4, (uint32_t)m_params.m_pJob_pool->get_total_threads()) : 0);
				if (!status)
				{
					return cECFailedUASTCRDOPostProcess;
				}
			}

			m_uastc_backend_output.m_slice_image_data[slice_index].resize(tex.get_size_in_bytes());
			memcpy(&m_uastc_backend_output.m_slice_image_data[slice_index][0], tex.get_ptr(), tex.get_size_in_bytes());
			
			m_uastc_backend_output.m_slice_image_crcs[slice_index] = basist::crc16(tex.get_ptr(), tex.get_size_in_bytes(), 0);
						
		} // slice_index
				
		return cECSuccess;
	}